

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_container_add(run_container_t *run,uint16_t pos)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int32_t le;
  int32_t offset;
  int32_t index;
  uint16_t pos_local;
  run_container_t *run_local;
  
  iVar2 = interleavedBinarySearch(run->runs,run->n_runs,pos);
  if (-1 < iVar2) {
    return false;
  }
  iVar1 = -iVar2;
  iVar3 = iVar1 + -2;
  if (-1 < iVar3) {
    iVar4 = (uint)pos - (uint)run->runs[iVar3].value;
    uVar5 = (uint)run->runs[iVar3].length;
    if (iVar4 <= (int)uVar5) {
      return false;
    }
    if (iVar4 == uVar5 + 1) {
      if ((iVar1 + -1 < run->n_runs) && ((uint)run->runs[iVar1 + -1].value == pos + 1)) {
        run->runs[iVar3].length =
             (run->runs[iVar1 + -1].value + run->runs[iVar1 + -1].length) - run->runs[iVar3].value;
        recoverRoomAtIndex(run,(short)iVar3 + 1);
        return true;
      }
      run->runs[iVar3].length = run->runs[iVar3].length + 1;
      return true;
    }
    if ((iVar1 + -1 < run->n_runs) && ((uint)run->runs[iVar1 + -1].value == pos + 1)) {
      run->runs[iVar1 + -1].value = pos;
      run->runs[iVar1 + -1].length = run->runs[iVar1 + -1].length + 1;
      return true;
    }
  }
  if (((iVar3 == -1) && (0 < run->n_runs)) && ((uint)run->runs->value == pos + 1)) {
    run->runs->length = run->runs->length + 1;
    run->runs->value = run->runs->value - 1;
  }
  else {
    makeRoomAtIndex(run,(short)iVar3 + 1);
    run->runs[iVar1 + -1].value = pos;
    run->runs[iVar1 + -1].length = 0;
  }
  return true;
}

Assistant:

bool run_container_add(run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) return false;  // already there
    index = -index - 2;            // points to preceding value, possibly -1
    if (index >= 0) {              // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset <= le) return false;  // already there
        if (offset == le + 1) {
            // we may need to fuse
            if (index + 1 < run->n_runs) {
                if (run->runs[index + 1].value == pos + 1) {
                    // indeed fusion is needed
                    run->runs[index].length = run->runs[index + 1].value +
                                              run->runs[index + 1].length -
                                              run->runs[index].value;
                    recoverRoomAtIndex(run, (uint16_t)(index + 1));
                    return true;
                }
            }
            run->runs[index].length++;
            return true;
        }
        if (index + 1 < run->n_runs) {
            // we may need to fuse
            if (run->runs[index + 1].value == pos + 1) {
                // indeed fusion is needed
                run->runs[index + 1].value = pos;
                run->runs[index + 1].length = run->runs[index + 1].length + 1;
                return true;
            }
        }
    }
    if (index == -1) {
        // we may need to extend the first run
        if (0 < run->n_runs) {
            if (run->runs[0].value == pos + 1) {
                run->runs[0].length++;
                run->runs[0].value--;
                return true;
            }
        }
    }
    makeRoomAtIndex(run, (uint16_t)(index + 1));
    run->runs[index + 1].value = pos;
    run->runs[index + 1].length = 0;
    return true;
}